

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O0

bool ON_FileSystem::IsFile(char *path)

{
  int iVar1;
  undefined1 local_a8 [8];
  stat s;
  char *path_local;
  
  if ((path == (char *)0x0) || (*path == '\0')) {
    path_local._7_1_ = false;
  }
  else {
    s.__glibc_reserved[2] = (__syscall_slong_t)path;
    iVar1 = stat(path,(stat *)local_a8);
    if (((iVar1 == 0) && (((uint)s.st_nlink & 0x4000) == 0)) && (((uint)s.st_nlink & 0x8000) != 0))
    {
      path_local._7_1_ = true;
    }
    else {
      path_local._7_1_ = false;
    }
  }
  return path_local._7_1_;
}

Assistant:

bool ON_FileSystem::IsFile(
  const char* path
  )
{
  if (0 == path || 0 == path[0])
    return false;
#if defined(ON_COMPILER_MSC) && defined(ON_RUNTIME_WIN)
  return ::PathFileExistsA(path) && 0 == ::PathIsDirectoryA(path);
#else
  struct stat s;
  if (0 == stat(path, &s))
  {
    if (0 == (s.st_mode & S_IFDIR) && 0 != (s.st_mode & S_IFREG))
      return true;
  }
  return false;
#endif
}